

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::Dimension::MergeFrom(Dimension *this,Dimension *from)

{
  ulong uVar1;
  LogMessage *other;
  Dimension_UnknownDimension *pDVar2;
  Dimension_ConstantDimension *pDVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/MIL.pb.cc"
               ,0x1406);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] == 1) {
    if (this->_oneof_case_[0] != 1) {
      clear_dimension(this);
      this->_oneof_case_[0] = 1;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pDVar3 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::Dimension_ConstantDimension>
                         (pAVar5);
      (this->dimension_).constant_ = pDVar3;
    }
    if (from->_oneof_case_[0] == 1) {
      puVar4 = (undefined1 *)(from->dimension_).constant_;
    }
    else {
      puVar4 = _Dimension_ConstantDimension_default_instance_;
    }
    Dimension_ConstantDimension::MergeFrom
              ((this->dimension_).constant_,(Dimension_ConstantDimension *)puVar4);
  }
  else if (from->_oneof_case_[0] == 2) {
    if (this->_oneof_case_[0] != 2) {
      clear_dimension(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar5 = *(Arena **)pAVar5;
      }
      pDVar2 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::MILSpec::Dimension_UnknownDimension>
                         (pAVar5);
      (this->dimension_).unknown_ = pDVar2;
    }
    if (from->_oneof_case_[0] == 2) {
      puVar4 = (undefined1 *)(from->dimension_).unknown_;
    }
    else {
      puVar4 = _Dimension_UnknownDimension_default_instance_;
    }
    Dimension_UnknownDimension::MergeFrom
              ((this->dimension_).unknown_,(Dimension_UnknownDimension *)puVar4);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Dimension::MergeFrom(const Dimension& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Dimension)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.dimension_case()) {
    case kConstant: {
      _internal_mutable_constant()->::CoreML::Specification::MILSpec::Dimension_ConstantDimension::MergeFrom(from._internal_constant());
      break;
    }
    case kUnknown: {
      _internal_mutable_unknown()->::CoreML::Specification::MILSpec::Dimension_UnknownDimension::MergeFrom(from._internal_unknown());
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}